

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O3

NetlistPortDeclaration * __thiscall
netlist::Netlist::addPortDeclaration(Netlist *this,Symbol *symbol)

{
  _Head_base<0UL,_netlist::NetlistNode_*,_false> _Var1;
  __uniq_ptr_impl<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_> local_20;
  
  _Var1._M_head_impl = (NetlistNode *)operator_new(0x60);
  (((NetlistNode *)&(_Var1._M_head_impl)->super_Node<netlist::NetlistNode,_netlist::NetlistEdge>)->
  super_Node<netlist::NetlistNode,_netlist::NetlistEdge>).edges.
  super__Vector_base<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (((NetlistNode *)&(_Var1._M_head_impl)->super_Node<netlist::NetlistNode,_netlist::NetlistEdge>)->
  super_Node<netlist::NetlistNode,_netlist::NetlistEdge>).edges.
  super__Vector_base<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (((NetlistNode *)&(_Var1._M_head_impl)->super_Node<netlist::NetlistNode,_netlist::NetlistEdge>)->
  super_Node<netlist::NetlistNode,_netlist::NetlistEdge>).edges.
  super__Vector_base<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NetlistNode::nextID = NetlistNode::nextID + 1;
  (_Var1._M_head_impl)->ID = NetlistNode::nextID;
  (_Var1._M_head_impl)->kind = PortDeclaration;
  (_Var1._M_head_impl)->symbol = symbol;
  (_Var1._M_head_impl)->edgeKind = None;
  (_Var1._M_head_impl)->blocked = false;
  (((NetlistNode *)&(_Var1._M_head_impl)->super_Node<netlist::NetlistNode,_netlist::NetlistEdge>)->
  super_Node<netlist::NetlistNode,_netlist::NetlistEdge>)._vptr_Node =
       (_func_int **)&PTR__NetlistPortDeclaration_005c6258;
  _Var1._M_head_impl[1].super_Node<netlist::NetlistNode,_netlist::NetlistEdge>._vptr_Node =
       (_func_int **)
       &_Var1._M_head_impl[1].super_Node<netlist::NetlistNode,_netlist::NetlistEdge>.edges.
        super__Vector_base<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  _Var1._M_head_impl[1].super_Node<netlist::NetlistNode,_netlist::NetlistEdge>.edges.
  super__Vector_base<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)&_Var1._M_head_impl[1].super_Node<netlist::NetlistNode,_netlist::NetlistEdge>.edges.
       super__Vector_base<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_local_buf[0] = '\0';
  slang::ast::Symbol::appendHierarchicalPath(symbol,(string *)(_Var1._M_head_impl + 1));
  local_20._M_t.
  super__Tuple_impl<0UL,_netlist::NetlistNode_*,_std::default_delete<netlist::NetlistNode>_>.
  super__Head_base<0UL,_netlist::NetlistNode_*,_false>._M_head_impl =
       (tuple<netlist::NetlistNode_*,_std::default_delete<netlist::NetlistNode>_>)
       (tuple<netlist::NetlistNode_*,_std::default_delete<netlist::NetlistNode>_>)_Var1._M_head_impl
  ;
  std::
  vector<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>,std::allocator<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>>>
  ::emplace_back<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>>
            ((vector<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>,std::allocator<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>>>
              *)&(this->super_DirectedGraph<netlist::NetlistNode,_netlist::NetlistEdge>).nodes,
             (unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_> *)
             &local_20);
  if ((_Tuple_impl<0UL,_netlist::NetlistNode_*,_std::default_delete<netlist::NetlistNode>_>)
      local_20._M_t.
      super__Tuple_impl<0UL,_netlist::NetlistNode_*,_std::default_delete<netlist::NetlistNode>_>.
      super__Head_base<0UL,_netlist::NetlistNode_*,_false>._M_head_impl != (NetlistNode *)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_netlist::NetlistNode_*,_std::default_delete<netlist::NetlistNode>_>
                          .super__Head_base<0UL,_netlist::NetlistNode_*,_false>._M_head_impl + 8))()
    ;
  }
  return (NetlistPortDeclaration *)
         (_Head_base<0UL,_netlist::NetlistNode_*,_false>)_Var1._M_head_impl;
}

Assistant:

NetlistPortDeclaration& addPortDeclaration(const ast::Symbol& symbol) {
        auto nodePtr = std::make_unique<NetlistPortDeclaration>(symbol);
        auto& node = nodePtr->as<NetlistPortDeclaration>();
        symbol.appendHierarchicalPath(node.hierarchicalPath);
        SLANG_ASSERT(lookupPort(nodePtr->hierarchicalPath) == nullptr &&
                     "Port declaration already exists");
        nodes.push_back(std::move(nodePtr));
        DEBUG_PRINT("New node: port declaration {}\n", node.hierarchicalPath);
        return node;
    }